

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::BufferGLImpl::CreateViewInternal
          (BufferGLImpl *this,BufferViewDesc *OrigViewDesc,IBufferView **ppView,bool bIsDefaultView)

{
  RenderDeviceGLImpl *pRVar1;
  BufferViewGLImpl *pBVar2;
  FixedBlockMemoryAllocator *pFVar3;
  bool bIsDefaultView_local;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pContext;
  string msg;
  RenderDeviceGLImpl *pDeviceGLImpl;
  BufferGLImpl *local_60;
  BufferViewDesc ViewDesc;
  
  bIsDefaultView_local = bIsDefaultView;
  if (ppView == (IBufferView **)0x0) {
    FormatString<char[36]>(&msg,(char (*) [36])"Buffer view pointer address is null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,399);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p == &msg.field_2) {
      return;
    }
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    return;
  }
  if (*ppView != (IBufferView *)0x0) {
    FormatString<char[64]>
              (&msg,(char (*) [64])"Overwriting reference to existing object may cause memory leaks"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x191);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  *ppView = (IBufferView *)0x0;
  pRVar1 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                        *)this);
  ViewDesc.super_DeviceObjectAttribs.Name = (OrigViewDesc->super_DeviceObjectAttribs).Name;
  ViewDesc.ViewType = OrigViewDesc->ViewType;
  ViewDesc.Format = OrigViewDesc->Format;
  ViewDesc._12_4_ = *(undefined4 *)&OrigViewDesc->field_0xc;
  ViewDesc.ByteOffset = OrigViewDesc->ByteOffset;
  ViewDesc.ByteWidth = OrigViewDesc->ByteWidth;
  pDeviceGLImpl = pRVar1;
  ValidateAndCorrectBufferViewDesc
            (&(this->super_BufferBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
              .m_Desc,&ViewDesc,
             (pRVar1->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_AdapterInfo.Buffer.
             StructuredBufferOffsetAlignment);
  pFVar3 = &(pRVar1->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_BuffViewObjAllocator;
  if (pFVar3 != (this->super_BufferBase<Diligent::EngineGLImplTraits>).m_dbgBuffViewAllocator) {
    FormatString<char[79]>
              (&msg,(char (*) [79])
                    "Buff view allocator does not match allocator provided at buffer initialization"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x19d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pRVar1->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pRVar1->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pContext.m_pObject = (DeviceContextGLImpl *)0x0;
  }
  else {
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
              ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)&pContext);
    if (pContext.m_pObject != (DeviceContextGLImpl *)0x0) goto LAB_00321a78;
  }
  FormatString<char[36]>(&msg,(char (*) [36])"Immediate context has been released");
  DebugAssertionFailed
            (msg._M_dataplus._M_p,"CreateViewInternal",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
             ,0x1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != &msg.field_2) {
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
  }
LAB_00321a78:
  msg._M_string_length = (size_type)(BufferGLImpl *)0x0;
  if (bIsDefaultView) {
    msg._M_string_length = (size_type)this;
  }
  msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_bde21f;
  msg.field_2._8_8_ = anon_var_dwarf_bde089;
  msg._M_dataplus._M_p = (pointer)pFVar3;
  local_60 = this;
  pBVar2 = MakeNewRCObj<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>::operator()
                     ((MakeNewRCObj<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                       *)&msg,&pDeviceGLImpl,&(pContext.m_pObject)->m_ContextState,&ViewDesc,
                      &local_60,&bIsDefaultView_local);
  *ppView = (IBufferView *)pBVar2;
  if (bIsDefaultView_local == false) {
    (**(code **)((long)(pBVar2->super_BufferViewBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
                       .super_ObjectBase<Diligent::IBufferViewGL>.
                       super_RefCountedObject<Diligent::IBufferViewGL>.super_IBufferViewGL.
                       super_IBufferView.super_IDeviceObject + 8))(pBVar2);
  }
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release(&pContext);
  return;
}

Assistant:

void BufferGLImpl::CreateViewInternal(const BufferViewDesc& OrigViewDesc, IBufferView** ppView, bool bIsDefaultView)
{
    VERIFY(ppView != nullptr, "Buffer view pointer address is null");
    if (!ppView) return;
    VERIFY(*ppView == nullptr, "Overwriting reference to existing object may cause memory leaks");

    *ppView = nullptr;

    try
    {
        auto* const pDeviceGLImpl = GetDevice();

        auto ViewDesc = OrigViewDesc;
        ValidateAndCorrectBufferViewDesc(m_Desc, ViewDesc, pDeviceGLImpl->GetAdapterInfo().Buffer.StructuredBufferOffsetAlignment);

        auto& BuffViewAllocator = pDeviceGLImpl->GetBuffViewObjAllocator();
        VERIFY(&BuffViewAllocator == &m_dbgBuffViewAllocator, "Buff view allocator does not match allocator provided at buffer initialization");

        auto pContext = pDeviceGLImpl->GetImmediateContext(0);
        VERIFY(pContext, "Immediate context has been released");
        auto& CtxState = pContext->GetContextState();

        *ppView = NEW_RC_OBJ(BuffViewAllocator, "BufferViewGLImpl instance", BufferViewGLImpl, bIsDefaultView ? this : nullptr)(pDeviceGLImpl, CtxState, ViewDesc, this, bIsDefaultView);

        if (!bIsDefaultView)
            (*ppView)->AddRef();
    }
    catch (const std::runtime_error&)
    {
        const auto* ViewTypeName = GetBufferViewTypeLiteralName(OrigViewDesc.ViewType);
        LOG_ERROR("Failed to create view '", (OrigViewDesc.Name ? OrigViewDesc.Name : ""), "' (", ViewTypeName, ") for buffer '", (m_Desc.Name ? m_Desc.Name : ""), "'");
    }
}